

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Clip_x86_avx::forward_inplace(Clip_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  uint uVar11;
  long lVar12;
  undefined1 (*pauVar13) [32];
  int iVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  
  iVar7 = bottom_top_blob->c;
  if (0 < (long)iVar7) {
    uVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    lVar12 = 0;
    do {
      pauVar13 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * lVar12 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      uVar3 = (this->super_Clip).min;
      uVar5 = (this->super_Clip).max;
      auVar18._4_4_ = uVar5;
      auVar18._0_4_ = uVar3;
      auVar18._8_8_ = 0;
      if ((int)uVar11 < 8) {
        uVar15 = 0;
      }
      else {
        auVar10 = vshufps_avx(auVar18,auVar18,0);
        auVar20._16_16_ = auVar10;
        auVar20._0_16_ = auVar10;
        auVar18 = vshufps_avx(auVar18,auVar18,0x55);
        auVar19._16_16_ = auVar18;
        auVar19._0_16_ = auVar18;
        iVar14 = 7;
        do {
          auVar9 = vmaxps_avx(auVar20,*pauVar13);
          auVar9 = vminps_avx(auVar9,auVar19);
          *pauVar13 = auVar9;
          pauVar13 = pauVar13 + 1;
          iVar14 = iVar14 + 8;
        } while (iVar14 < (int)uVar11);
        uVar4 = (this->super_Clip).min;
        uVar6 = (this->super_Clip).max;
        auVar18._4_4_ = uVar6;
        auVar18._0_4_ = uVar4;
        auVar18._8_8_ = 0;
        uVar15 = uVar11 & 0xfffffff8;
      }
      if ((int)(uVar15 | 3) < (int)uVar11) {
        auVar10 = vshufps_avx(auVar18,auVar18,0);
        auVar18 = vshufps_avx(auVar18,auVar18,0x55);
        uVar16 = uVar15;
        do {
          auVar8 = vmaxps_avx(auVar10,*(undefined1 (*) [16])*pauVar13);
          auVar8 = vminps_avx(auVar8,auVar18);
          *(undefined1 (*) [16])*pauVar13 = auVar8;
          pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
          uVar15 = uVar16 + 4;
          iVar14 = uVar16 + 7;
          uVar16 = uVar15;
        } while (iVar14 < (int)uVar11);
      }
      if (uVar11 - uVar15 != 0 && (int)uVar15 <= (int)uVar11) {
        lVar17 = 0;
        do {
          fVar1 = (this->super_Clip).min;
          fVar2 = *(float *)(*pauVar13 + lVar17 * 4);
          if (*(float *)(*pauVar13 + lVar17 * 4) < fVar1) {
            *(float *)(*pauVar13 + lVar17 * 4) = fVar1;
            fVar2 = fVar1;
          }
          fVar1 = (this->super_Clip).max;
          if (fVar1 < fVar2) {
            *(float *)(*pauVar13 + lVar17 * 4) = fVar1;
          }
          lVar17 = lVar17 + 1;
        } while (uVar11 - uVar15 != (int)lVar17);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != iVar7);
  }
  return 0;
}

Assistant:

int Clip_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _min_avx512 = _mm512_set1_ps(min);
        __m512 _max_avx512 = _mm512_set1_ps(max);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_max_ps(_p, _min_avx512);
            _p = _mm512_min_ps(_p, _max_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _min_avx = _mm256_set1_ps(min);
        __m256 _max_avx = _mm256_set1_ps(max);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_max_ps(_p, _min_avx);
            _p = _mm256_min_ps(_p, _max_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _min = _mm_set1_ps(min);
        __m128 _max = _mm_set1_ps(max);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_max_ps(_p, _min);
            _p = _mm_min_ps(_p, _max);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < min)
                *ptr = min;
            if (*ptr > max)
                *ptr = max;
            ptr++;
        }
    }

    return 0;
}